

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O3

void Abc_NtkPrintGates(Abc_Ntk_t *pNtk,int fUseLibrary)

{
  int iVar1;
  int iVar2;
  Abc_NtkFunc_t AVar3;
  long *plVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  Mio_Gate_t **ppMVar9;
  Abc_Obj_t *pAVar10;
  char *pcVar11;
  size_t sVar12;
  char *pcVar13;
  Mio_Gate_t *pMVar14;
  Vec_Ptr_t *pVVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  bool bVar21;
  bool bVar22;
  double dVar23;
  double dVar24;
  int local_54;
  
  AVar3 = pNtk->ntkFunc;
  if (AVar3 == ABC_FUNC_MAP && fUseLibrary != 0) {
    uVar5 = Mio_LibraryReadGateNum((Mio_Library_t *)pNtk->pManFunc);
    ppMVar9 = Mio_LibraryReadGateArray((Mio_Library_t *)pNtk->pManFunc);
    uVar18 = (ulong)uVar5;
    if (0 < (int)uVar5) {
      uVar17 = 0;
      do {
        Mio_GateSetValue(ppMVar9[uVar17],0);
        uVar17 = uVar17 + 1;
      } while (uVar18 != uVar17);
    }
    pVVar15 = pNtk->vObjs;
    if (pVVar15->nSize < 1) {
      uVar16 = 0;
    }
    else {
      uVar20 = 0;
      uVar16 = 0;
      do {
        pAVar10 = (Abc_Obj_t *)pVVar15->pArray[uVar20];
        if ((pAVar10 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar10->field_0x14 & 0xf) == 7)) {
          if ((pAVar10->pNtk->ntkFunc == ABC_FUNC_MAP) && ((pAVar10->vFanins).nSize == 1)) {
            bVar21 = (pAVar10->field_5).pData == (void *)0x0;
          }
          else {
            bVar21 = false;
          }
          if ((uVar20 != 0) && (!bVar21)) {
            pMVar14 = (Mio_Gate_t *)(pAVar10->field_5).pData;
            iVar6 = Mio_GateReadValue(pMVar14);
            Mio_GateSetValue(pMVar14,iVar6 + 1);
            uVar16 = uVar16 + 1;
            pAVar10 = Abc_NtkFetchTwinNode(pAVar10);
            uVar20 = (uVar20 + 1) - (uint)(pAVar10 == (Abc_Obj_t *)0x0);
            pVVar15 = pNtk->vObjs;
          }
        }
        uVar20 = uVar20 + 1;
      } while ((int)uVar20 < pVVar15->nSize);
    }
    if ((int)uVar5 < 1) {
      dVar23 = Abc_NtkGetMappedArea(pNtk);
      uVar20 = 5;
    }
    else {
      uVar20 = 5;
      uVar17 = 0;
      do {
        iVar6 = Mio_GateReadValue(ppMVar9[uVar17]);
        uVar7 = uVar20;
        if (iVar6 != 0) {
          pcVar11 = Mio_GateReadName(ppMVar9[uVar17]);
          sVar12 = strlen(pcVar11);
          uVar7 = (uint)sVar12;
          if ((int)(uint)sVar12 < (int)uVar20) {
            uVar7 = uVar20;
          }
        }
        uVar20 = uVar7;
        uVar17 = uVar17 + 1;
      } while (uVar18 != uVar17);
      dVar23 = Abc_NtkGetMappedArea(pNtk);
      if (0 < (int)uVar5) {
        uVar17 = 0;
        do {
          uVar5 = Mio_GateReadValue(ppMVar9[uVar17]);
          if (uVar5 != 0) {
            dVar24 = Mio_GateReadArea(ppMVar9[uVar17]);
            pcVar11 = Mio_GateReadName(ppMVar9[uVar17]);
            uVar7 = Mio_GateReadPinNum(ppMVar9[uVar17]);
            pcVar13 = Mio_GateReadForm(ppMVar9[uVar17]);
            printf("%-*s   Fanin = %2d   Instance = %8d   Area = %10.2f   %6.2f %%    %s\n",
                   dVar24 * (double)(int)uVar5,(dVar24 * (double)(int)uVar5 * 100.0) / dVar23,
                   (ulong)uVar20,pcVar11,(ulong)uVar7,(ulong)uVar5,pcVar13);
          }
          uVar17 = uVar17 + 1;
        } while (uVar18 != uVar17);
      }
    }
    printf("%-*s                Instance = %8d   Area = %10.2f   %6.2f %%\n",dVar23,
           0x4059000000000000,(ulong)uVar20,"TOTAL",(ulong)uVar16);
    return;
  }
  bVar21 = true;
  if (AVar3 == ABC_FUNC_BDD) {
    if (pNtk->ntkType == ABC_NTK_LOGIC) {
      iVar6 = Abc_NtkBddToSop(pNtk,-1,1000000000);
      if (iVar6 == 0) {
        puts("Abc_NtkPrintGates(): Converting to SOPs has failed.");
        return;
      }
      bVar21 = false;
    }
  }
  else if ((AVar3 == ABC_FUNC_AIG) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    return;
  }
  pVVar15 = pNtk->vObjs;
  if (pVVar15->nSize < 1) {
    iVar6 = 0;
    iVar1 = 0;
    iVar2 = 0;
    local_54 = 0;
    uVar5 = 0;
    uVar16 = 0;
    uVar20 = 0;
  }
  else {
    lVar19 = 0;
    uVar20 = 0;
    uVar16 = 0;
    uVar5 = 0;
    local_54 = 0;
    iVar2 = 0;
    iVar1 = 0;
    iVar6 = 0;
    do {
      plVar4 = (long *)pVVar15->pArray[lVar19];
      if ((plVar4 != (long *)0x0) && ((*(uint *)((long)plVar4 + 0x14) & 0xf) == 7)) {
        if ((*(int *)(*plVar4 + 4) == 4) && (*(int *)((long)plVar4 + 0x1c) == 1)) {
          bVar22 = plVar4[7] == 0;
        }
        else {
          bVar22 = false;
        }
        if ((lVar19 != 0) && (!bVar22)) {
          pMVar14 = (Mio_Gate_t *)plVar4[7];
          if (pNtk->ntkFunc == ABC_FUNC_MAP) {
            pMVar14 = (Mio_Gate_t *)Mio_GateReadSop(pMVar14);
          }
          iVar8 = Abc_SopIsConst0((char *)pMVar14);
          if ((iVar8 == 0) && (iVar8 = Abc_SopIsConst1((char *)pMVar14), iVar8 == 0)) {
            iVar8 = Abc_SopIsBuf((char *)pMVar14);
            if (iVar8 == 0) {
              iVar8 = Abc_SopIsInv((char *)pMVar14);
              if (iVar8 == 0) {
                iVar8 = Abc_SopIsComplement((char *)pMVar14);
                if (((iVar8 == 0) && (iVar8 = Abc_SopIsAndType((char *)pMVar14), iVar8 != 0)) ||
                   ((iVar8 = Abc_SopIsComplement((char *)pMVar14), iVar8 != 0 &&
                    (iVar8 = Abc_SopIsOrType((char *)pMVar14), iVar8 != 0)))) {
                  iVar1 = iVar1 + 1;
                }
                else {
                  iVar8 = Abc_SopIsComplement((char *)pMVar14);
                  if (((iVar8 == 0) || (iVar8 = Abc_SopIsAndType((char *)pMVar14), iVar8 == 0)) &&
                     ((iVar8 = Abc_SopIsComplement((char *)pMVar14), iVar8 != 0 ||
                      (iVar8 = Abc_SopIsOrType((char *)pMVar14), iVar8 == 0)))) {
                    local_54 = local_54 + 1;
                  }
                  else {
                    iVar2 = iVar2 + 1;
                  }
                }
              }
              else {
                iVar6 = iVar6 + 1;
              }
            }
            else {
              uVar16 = uVar16 + 1;
            }
          }
          else {
            uVar20 = uVar20 + 1;
          }
          uVar5 = uVar5 + 1;
          pVVar15 = pNtk->vObjs;
        }
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < pVVar15->nSize);
  }
  dVar23 = (double)(int)uVar5;
  printf("Const        = %8d    %6.2f %%\n",((double)(int)uVar20 * 100.0) / dVar23,(ulong)uVar20);
  printf("Buffer       = %8d    %6.2f %%\n",((double)(int)uVar16 * 100.0) / dVar23,(ulong)uVar16);
  printf("Inverter     = %8d    %6.2f %%\n",((double)iVar6 * 100.0) / dVar23);
  printf("And          = %8d    %6.2f %%\n",((double)iVar1 * 100.0) / dVar23);
  printf("Or           = %8d    %6.2f %%\n",((double)iVar2 * 100.0) / dVar23);
  printf("Other        = %8d    %6.2f %%\n",((double)local_54 * 100.0) / dVar23);
  printf("TOTAL        = %8d    %6.2f %%\n",(dVar23 * 100.0) / dVar23,(ulong)uVar5);
  if (bVar21) {
    return;
  }
  Abc_NtkSopToBdd(pNtk);
  return;
}

Assistant:

void Abc_NtkPrintGates( Abc_Ntk_t * pNtk, int fUseLibrary )
{
    Abc_Obj_t * pObj;
    int fHasBdds, i;
    int CountConst, CountBuf, CountInv, CountAnd, CountOr, CountOther, CounterTotal;
    char * pSop;

    if ( fUseLibrary && Abc_NtkHasMapping(pNtk) )
    {
        Mio_Gate_t ** ppGates;
        double Area, AreaTotal;
        int Counter, nGates, i, nGateNameLen;

        // clean value of all gates
        nGates = Mio_LibraryReadGateNum( (Mio_Library_t *)pNtk->pManFunc );
        ppGates = Mio_LibraryReadGateArray( (Mio_Library_t *)pNtk->pManFunc );
        for ( i = 0; i < nGates; i++ )
            Mio_GateSetValue( ppGates[i], 0 );

        // count the gates by name
        CounterTotal = 0;
        Abc_NtkForEachNodeNotBarBuf( pNtk, pObj, i )
        {
            if ( i == 0 ) continue;
            Mio_GateSetValue( (Mio_Gate_t *)pObj->pData, 1 + Mio_GateReadValue((Mio_Gate_t *)pObj->pData) );
            CounterTotal++;
            // assuming that twin gates follow each other
            if ( Abc_NtkFetchTwinNode(pObj) )
                i++;
        }

        // determine the longest gate name
        nGateNameLen = 5;
        for ( i = 0; i < nGates; i++ )
        {
            Counter = Mio_GateReadValue( ppGates[i] );
            if ( Counter == 0 )
                continue;
            nGateNameLen = Abc_MaxInt( nGateNameLen, strlen(Mio_GateReadName(ppGates[i])) );
        }

        // print the gates
        AreaTotal = Abc_NtkGetMappedArea(pNtk);
        for ( i = 0; i < nGates; i++ )
        {
            Counter = Mio_GateReadValue( ppGates[i] );
            if ( Counter == 0 )
                continue;
            Area = Counter * Mio_GateReadArea( ppGates[i] );
            printf( "%-*s   Fanin = %2d   Instance = %8d   Area = %10.2f   %6.2f %%    %s\n",
                nGateNameLen, Mio_GateReadName( ppGates[i] ),
                Mio_GateReadPinNum( ppGates[i] ),
                Counter, Area, 100.0 * Area / AreaTotal,
                Mio_GateReadForm(ppGates[i]) );
        }
        printf( "%-*s                Instance = %8d   Area = %10.2f   %6.2f %%\n",
            nGateNameLen, "TOTAL",
            CounterTotal, AreaTotal, 100.0 );
        return;
    }

    if ( Abc_NtkIsAigLogic(pNtk) )
        return;

    // transform logic functions from BDD to SOP
    if ( (fHasBdds = Abc_NtkIsBddLogic(pNtk)) )
    {
        if ( !Abc_NtkBddToSop(pNtk, -1, ABC_INFINITY) )
        {
            printf( "Abc_NtkPrintGates(): Converting to SOPs has failed.\n" );
            return;
        }
    }

    // get hold of the SOP of the node
    CountConst = CountBuf = CountInv = CountAnd = CountOr = CountOther = CounterTotal = 0;
    Abc_NtkForEachNodeNotBarBuf( pNtk, pObj, i )
    {
        if ( i == 0 ) continue;
        if ( Abc_NtkHasMapping(pNtk) )
            pSop = Mio_GateReadSop((Mio_Gate_t *)pObj->pData);
        else
            pSop = (char *)pObj->pData;
        // collect the stats
        if ( Abc_SopIsConst0(pSop) || Abc_SopIsConst1(pSop) )
            CountConst++;
        else if ( Abc_SopIsBuf(pSop) )
            CountBuf++;
        else if ( Abc_SopIsInv(pSop) )
            CountInv++;
        else if ( (!Abc_SopIsComplement(pSop) && Abc_SopIsAndType(pSop)) ||
                  ( Abc_SopIsComplement(pSop) && Abc_SopIsOrType(pSop)) )
            CountAnd++;
        else if ( ( Abc_SopIsComplement(pSop) && Abc_SopIsAndType(pSop)) ||
                  (!Abc_SopIsComplement(pSop) && Abc_SopIsOrType(pSop)) )
            CountOr++;
        else
            CountOther++;
        CounterTotal++;
    }
    printf( "Const        = %8d    %6.2f %%\n", CountConst  ,  100.0 * CountConst   / CounterTotal );
    printf( "Buffer       = %8d    %6.2f %%\n", CountBuf    ,  100.0 * CountBuf     / CounterTotal );
    printf( "Inverter     = %8d    %6.2f %%\n", CountInv    ,  100.0 * CountInv     / CounterTotal );
    printf( "And          = %8d    %6.2f %%\n", CountAnd    ,  100.0 * CountAnd     / CounterTotal );
    printf( "Or           = %8d    %6.2f %%\n", CountOr     ,  100.0 * CountOr      / CounterTotal );
    printf( "Other        = %8d    %6.2f %%\n", CountOther  ,  100.0 * CountOther   / CounterTotal );
    printf( "TOTAL        = %8d    %6.2f %%\n", CounterTotal,  100.0 * CounterTotal / CounterTotal );

    // convert the network back into BDDs if this is how it was
    if ( fHasBdds )
        Abc_NtkSopToBdd(pNtk);
}